

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::ReadGroup<google::protobuf::Message>
               (int field_number,CodedInputStream *input,Message *value)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = input->recursion_budget_;
  input->recursion_budget_ = iVar1 + -1;
  if ((0 < iVar1) &&
     (bVar2 = MessageLite::MergePartialFromCodedStream(&value->super_MessageLite,input), bVar2)) {
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
      return input->last_tag_ == field_number * 8 + 4U;
    }
    __assert_fail("recursion_budget_ < recursion_limit_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.h"
                  ,0x5e6,
                  "void google::protobuf::io::CodedInputStream::UnsafeDecrementRecursionDepth()");
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadGroup(int field_number,
                                      io::CodedInputStream* input,
                                      MessageType* value) {
  if (!input->IncrementRecursionDepth()) return false;
  if (!value->MergePartialFromCodedStream(input)) return false;
  input->UnsafeDecrementRecursionDepth();
  // Make sure the last thing read was an end tag for this group.
  if (!input->LastTagWas(MakeTag(field_number, WIRETYPE_END_GROUP))) {
    return false;
  }
  return true;
}